

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackIFWGenerator.cxx
# Opt level: O2

char * __thiscall cmCPackIFWGenerator::GetPackagingInstallPrefix(cmCPackIFWGenerator *this)

{
  char *pcVar1;
  char *pcVar2;
  string tmpPref;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  char *local_48 [4];
  string local_28;
  
  pcVar1 = cmCPackGenerator::GetPackagingInstallPrefix(&this->super_cmCPackGenerator);
  pcVar2 = "";
  if (pcVar1 != (char *)0x0) {
    pcVar2 = pcVar1;
  }
  std::__cxx11::string::string((string *)local_48,pcVar2,(allocator *)&bStack_88);
  if ((this->super_cmCPackGenerator).Components._M_t._M_impl.super__Rb_tree_header._M_node_count ==
      0) {
    GetRootPackageName_abi_cxx11_(&local_28,this);
    std::operator+(&local_68,"packages/",&local_28);
    std::operator+(&bStack_88,&local_68,"/data");
    std::__cxx11::string::append((string *)local_48);
    std::__cxx11::string::~string((string *)&bStack_88);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&local_28);
  }
  std::__cxx11::string::string
            ((string *)&bStack_88,"CPACK_IFW_PACKAGING_INSTALL_PREFIX",(allocator *)&local_68);
  cmCPackGenerator::SetOption(&this->super_cmCPackGenerator,&bStack_88,local_48[0]);
  std::__cxx11::string::~string((string *)&bStack_88);
  std::__cxx11::string::string
            ((string *)&bStack_88,"CPACK_IFW_PACKAGING_INSTALL_PREFIX",(allocator *)&local_68);
  pcVar2 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&bStack_88);
  std::__cxx11::string::~string((string *)&bStack_88);
  std::__cxx11::string::~string((string *)local_48);
  return pcVar2;
}

Assistant:

const char *cmCPackIFWGenerator::GetPackagingInstallPrefix()
{
  const char *defPrefix = cmCPackGenerator::GetPackagingInstallPrefix();

  std::string tmpPref = defPrefix ? defPrefix : "";

  if(this->Components.empty())
    {
    tmpPref += "packages/" + GetRootPackageName() + "/data";
    }

  this->SetOption("CPACK_IFW_PACKAGING_INSTALL_PREFIX", tmpPref.c_str());

  return this->GetOption("CPACK_IFW_PACKAGING_INSTALL_PREFIX");
}